

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::GetLinkLibsCMP0065
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *linkLanguage,
          cmGeneratorTarget *tgt)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  cmState *this_00;
  ostream *poVar6;
  PolicyID id;
  PolicyID id_00;
  _Alloc_hider _Var7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  ostringstream w;
  string local_238;
  string local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  string *local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 local_188;
  char *local_180;
  ios_base local_138 [264];
  
  local_1f8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1f8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1f0 = linkLanguage;
  TVar4 = cmGeneratorTarget::GetType(tgt);
  if (TVar4 == EXECUTABLE) {
    this_00 = cmStateSnapshot::GetState(&(this->super_cmOutputConverter).StateSnapshot);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"TARGET_SUPPORTS_SHARED_LIBS","");
    bVar2 = cmState::GetGlobalPropertyAsBool(this_00,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  if (bVar2 == false) {
    return __return_storage_ptr__;
  }
  PVar5 = cmPolicies::PolicyMap::Get(&tgt->PolicyMap,CMP0065);
  switch(PVar5) {
  case WARN:
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ENABLE_EXPORTS","");
    bVar2 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)local_1a8);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      pcVar1 = this->Makefile;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,"CMAKE_POLICY_WARNING_CMP0065","");
      bVar2 = cmMakefile::PolicyOptionalWarningEnabled(pcVar1,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
    }
    if (bVar2 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_238,(cmPolicies *)&DAT_00000041,id_00);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,
                 "\nFor compatibility with older versions of CMake, additional flags may be added to export symbols on all executables regardless of their ENABLE_EXPORTS property."
                 ,0xa0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_238,
                          &this->DirectoryBacktrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  case OLD:
    bVar3 = cmTarget::IsAIX(tgt->Target);
    if (bVar3) {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"ENABLE_EXPORTS","");
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(tgt,&local_238);
    }
    else {
      bVar2 = false;
    }
    bVar2 = (bool)(bVar2 ^ 1);
    if ((bVar3) &&
       (local_218.field_2._M_allocated_capacity = local_238.field_2._M_allocated_capacity,
       _Var7._M_p = local_238._M_dataplus._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_238._M_dataplus._M_p != &local_238.field_2)) {
LAB_003c8e4e:
      operator_delete(_Var7._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    break;
  case NEW:
    goto switchD_003c8bb8_caseD_2;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    cmPolicies::GetRequiredPolicyError_abi_cxx11_
              ((string *)local_1a8,(cmPolicies *)&DAT_00000041,id);
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)local_1a8,
                        &this->DirectoryBacktrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
    }
switchD_003c8bb8_caseD_2:
    bVar2 = cmTarget::IsAIX(tgt->Target);
    if (!bVar2) {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"ENABLE_EXPORTS","");
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(tgt,&local_218);
      _Var7._M_p = local_218._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p == &local_218.field_2) break;
      goto LAB_003c8e4e;
    }
    bVar2 = false;
    break;
  default:
    goto switchD_003c8bb8_default;
  }
  if (bVar2 != false) {
    pcVar1 = this->Makefile;
    local_198._8_8_ = (local_1f0->_M_dataplus)._M_p;
    local_198._M_allocated_capacity = local_1f0->_M_string_length;
    local_1a8._0_8_ = (pointer)0x1a;
    local_1a8._8_8_ = "CMAKE_SHARED_LIBRARY_LINK_";
    local_188 = 6;
    local_180 = "_FLAGS";
    views._M_len = 3;
    views._M_array = (iterator)local_1a8;
    cmCatViews_abi_cxx11_(&local_1c8,views);
    cmMakefile::GetSafeDefinition(pcVar1,&local_1c8);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
switchD_003c8bb8_default:
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetLinkLibsCMP0065(
  std::string const& linkLanguage, cmGeneratorTarget& tgt) const
{
  std::string linkFlags;

  // Flags to link an executable to shared libraries.
  if (tgt.GetType() == cmStateEnums::EXECUTABLE &&
      this->StateSnapshot.GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    bool add_shlib_flags = false;
    switch (tgt.GetPolicyStatusCMP0065()) {
      case cmPolicies::WARN:
        if (!tgt.GetPropertyAsBool("ENABLE_EXPORTS") &&
            this->Makefile->PolicyOptionalWarningEnabled(
              "CMAKE_POLICY_WARNING_CMP0065")) {
          std::ostringstream w;
          /* clang-format off */
            w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0065) << "\n"
              "For compatibility with older versions of CMake, "
              "additional flags may be added to export symbols on all "
              "executables regardless of their ENABLE_EXPORTS property.";
          /* clang-format on */
          this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to always add the flags, except on AIX where
        // we compute symbol exports if ENABLE_EXPORTS is on.
        add_shlib_flags =
          !(tgt.Target->IsAIX() && tgt.GetPropertyAsBool("ENABLE_EXPORTS"));
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0065));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to only add the flags if ENABLE_EXPORTS is on,
        // except on AIX where we compute symbol exports.
        add_shlib_flags =
          !tgt.Target->IsAIX() && tgt.GetPropertyAsBool("ENABLE_EXPORTS");
        break;
    }

    if (add_shlib_flags) {
      linkFlags = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_SHARED_LIBRARY_LINK_", linkLanguage, "_FLAGS"));
    }
  }
  return linkFlags;
}